

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  Item *pIVar5;
  pointer pnVar6;
  pointer pnVar7;
  undefined8 uVar8;
  int32_t iVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar11;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar12;
  int iVar13;
  int iVar14;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  cpp_dec_float<100U,_int,_void> *pcVar15;
  cpp_dec_float<100U,_int,_void> *pcVar16;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar17;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar18;
  cpp_dec_float<100U,_int,_void> local_198;
  undefined1 local_148 [80];
  cpp_dec_float<100U,_int,_void> local_f8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a8;
  cpp_dec_float<100U,_int,_void> *local_a0;
  cpp_dec_float<100U,_int,_void> local_98;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  local_198.fpclass = cpp_dec_float_finite;
  local_198.prec_elem = 0x10;
  local_198.data._M_elems[0] = 0;
  local_198.data._M_elems[1] = 0;
  local_198.data._M_elems[2] = 0;
  local_198.data._M_elems[3] = 0;
  local_198.data._M_elems[4] = 0;
  local_198.data._M_elems[5] = 0;
  local_198.data._M_elems[6] = 0;
  local_198.data._M_elems[7] = 0;
  local_198.data._M_elems[8] = 0;
  local_198.data._M_elems[9] = 0;
  local_198.data._M_elems[10] = 0;
  local_198.data._M_elems[0xb] = 0;
  local_198.data._M_elems[0xc] = 0;
  local_198.data._M_elems[0xd] = 0;
  local_198.data._M_elems._56_5_ = 0;
  local_198.data._M_elems[0xf]._1_3_ = 0;
  local_198.exp = 0;
  local_198.neg = false;
  local_98.fpclass = cpp_dec_float_finite;
  local_98.prec_elem = 0x10;
  local_98.data._M_elems[0] = 0;
  local_98.data._M_elems[1] = 0;
  local_98.data._M_elems[2] = 0;
  local_98.data._M_elems[3] = 0;
  local_98.data._M_elems[4] = 0;
  local_98.data._M_elems[5] = 0;
  local_98.data._M_elems[6] = 0;
  local_98.data._M_elems[7] = 0;
  local_98.data._M_elems[8] = 0;
  local_98.data._M_elems[9] = 0;
  local_98.data._M_elems[10] = 0;
  local_98.data._M_elems[0xb] = 0;
  local_98.data._M_elems[0xc] = 0;
  local_98.data._M_elems[0xd] = 0;
  local_98.data._M_elems._56_5_ = 0;
  local_98.data._M_elems[0xf]._1_3_ = 0;
  local_98.exp = 0;
  local_98.neg = false;
  pSVar2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar3 = pSVar2->thePvec;
  pUVar4 = pSVar2->theCoPvec;
  iVar13 = (id->super_DataKey).info * pSVar2->theRep;
  if (iVar13 < 0) {
    if (0 < pSVar2->theRep *
            ((pSVar2->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[nr]) {
      this_00 = &pUVar4->thedelta;
      goto LAB_0048ddea;
    }
    pVVar18 = pSVar2->theCoUbound;
    pVVar11 = pSVar2->theCoLbound;
    pnVar6 = (pUVar4->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_198.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[nr].m_backend;
    local_198.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[nr].m_backend + 8);
    local_198.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x10);
    local_198.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x18);
    local_198.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x20);
    local_198.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x28);
    local_198.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x30);
    uVar8 = *(undefined8 *)((long)(pnVar6 + nr) + 0x38);
    local_198.data._M_elems._56_5_ = SUB85(uVar8,0);
    local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_198.exp = *(int *)((long)(pnVar6 + nr) + 0x40);
    local_198.neg = *(bool *)((long)(pnVar6 + nr) + 0x44);
    local_198._72_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x48);
    pnVar6 = (pUVar4->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98.exp = pnVar6[nr].m_backend.exp;
    local_98.neg = pnVar6[nr].m_backend.neg;
    local_98.fpclass = pnVar6[nr].m_backend.fpclass;
    local_98.prec_elem = pnVar6[nr].m_backend.prec_elem;
    local_98.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[nr].m_backend.data;
    local_98.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[nr].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x10);
    local_98.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x20);
    local_98.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_98.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x30);
    local_98.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar8 = *(undefined8 *)(puVar1 + 2);
    local_98.data._M_elems._56_5_ = SUB85(uVar8,0);
    local_98.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_a0 = &maxabs->m_backend;
    if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_0048e0f5:
      pVVar12 = ((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theCoUbound;
    }
    else {
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 0x10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems[6] = 0;
      local_f8.data._M_elems[7] = 0;
      local_f8.data._M_elems[8] = 0;
      local_f8.data._M_elems[9] = 0;
      local_f8.data._M_elems[10] = 0;
      local_f8.data._M_elems[0xb] = 0;
      local_f8.data._M_elems[0xc] = 0;
      local_f8.data._M_elems[0xd] = 0;
      local_f8.data._M_elems._56_5_ = 0;
      local_f8.data._M_elems[0xf]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_f8,0.0);
      iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_98,&local_f8);
      if (iVar13 < 1) goto LAB_0048e0f5;
      pVVar12 = ((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theCoLbound;
    }
    pcVar16 = &(pVVar12->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
    pcVar15 = &(pUVar4->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
    local_148._72_4_ = cpp_dec_float_finite;
    local_148._76_4_ = 0x10;
    local_148._0_4_ = 0;
    local_148._4_4_ = 0;
    local_148._8_4_ = 0;
    local_148._12_4_ = 0;
    local_148._16_4_ = 0;
    local_148._20_4_ = 0;
    local_148._24_4_ = 0;
    local_148._28_4_ = 0;
    local_148._32_4_ = 0;
    local_148._36_4_ = 0;
    local_148._40_4_ = 0;
    local_148._44_4_ = 0;
    local_148._48_4_ = 0;
    local_148._52_4_ = 0;
    local_148._56_5_ = 0;
    local_148._61_3_ = 0;
    local_148._64_4_ = 0;
    local_148[0x44] = false;
    if ((cpp_dec_float<100U,_int,_void> *)local_148 == pcVar15) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                ((cpp_dec_float<100U,_int,_void> *)local_148,pcVar16);
      if (local_148._0_4_ != 0 || local_148._72_4_ != cpp_dec_float_finite) {
        local_148[0x44] = local_148[0x44] ^ 1;
      }
    }
    else {
      if ((cpp_dec_float<100U,_int,_void> *)local_148 != pcVar16) {
        local_148._0_8_ = *(undefined8 *)(pcVar16->data)._M_elems;
        local_148._8_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 2);
        local_148._16_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 4);
        local_148._24_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 6);
        local_148._32_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 8);
        local_148._40_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 10);
        local_148._48_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 0xc);
        uVar8 = *(undefined8 *)((pcVar16->data)._M_elems + 0xe);
        local_148._56_5_ = (undefined5)uVar8;
        local_148._61_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_148._64_4_ = pcVar16->exp;
        local_148[0x44] = pcVar16->neg;
        local_148._72_4_ = pcVar16->fpclass;
        local_148._76_4_ = pcVar16->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                ((cpp_dec_float<100U,_int,_void> *)local_148,pcVar15);
    }
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems._56_5_ = 0;
    local_f8.data._M_elems[0xf]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_f8,(cpp_dec_float<100U,_int,_void> *)local_148,&local_98);
    *(undefined8 *)((sel->m_backend).data._M_elems + 0xc) = local_f8.data._M_elems._48_8_;
    *(ulong *)((sel->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
    *(undefined8 *)((sel->m_backend).data._M_elems + 8) = local_f8.data._M_elems._32_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 10) = local_f8.data._M_elems._40_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_f8.data._M_elems._16_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 6) = local_f8.data._M_elems._24_8_;
    *(undefined8 *)(sel->m_backend).data._M_elems = local_f8.data._M_elems._0_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 2) = local_f8.data._M_elems._8_8_;
    (sel->m_backend).exp = local_f8.exp;
    (sel->m_backend).neg = local_f8.neg;
    (sel->m_backend).fpclass = local_f8.fpclass;
    (sel->m_backend).prec_elem = local_f8.prec_elem;
    goto LAB_0048e2f1;
  }
  if (iVar13 == 0) {
    return true;
  }
  pVVar18 = pSVar2->theUbound;
  local_a8 = pSVar2->theLbound;
  pIVar5 = (pSVar2->thevectors->set).theitem;
  iVar13 = (pSVar2->thevectors->set).thekey[nr].idx;
  local_f8.fpclass = cpp_dec_float_finite;
  local_f8.prec_elem = 0x10;
  local_f8.data._M_elems[0] = 0;
  local_f8.data._M_elems[1] = 0;
  local_f8.data._M_elems[2] = 0;
  local_f8.data._M_elems[3] = 0;
  local_f8.data._M_elems[4] = 0;
  local_f8.data._M_elems[5] = 0;
  local_f8.data._M_elems[6] = 0;
  local_f8.data._M_elems[7] = 0;
  local_f8.data._M_elems[8] = 0;
  local_f8.data._M_elems[9] = 0;
  local_f8.data._M_elems[10] = 0;
  local_f8.data._M_elems[0xb] = 0;
  local_f8.data._M_elems[0xc] = 0;
  local_f8.data._M_elems[0xd] = 0;
  local_f8.data._M_elems._56_5_ = 0;
  local_f8.data._M_elems[0xf]._1_3_ = 0;
  local_f8.exp = 0;
  local_f8.neg = false;
  iVar14 = pIVar5[iVar13].data.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  local_a0 = &maxabs->m_backend;
  local_48 = &pUVar3->thedelta;
  local_40 = pUVar3;
  local_38 = this;
  if (0 < iVar14) {
    pNVar17 = pIVar5[iVar13].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    iVar14 = iVar14 + 1;
    do {
      pNVar10 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pUVar4->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + pNVar17->idx);
      local_148._72_4_ = cpp_dec_float_finite;
      local_148._76_4_ = 0x10;
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      local_148._16_4_ = 0;
      local_148._20_4_ = 0;
      local_148._24_4_ = 0;
      local_148._28_4_ = 0;
      local_148._32_4_ = 0;
      local_148._36_4_ = 0;
      local_148._40_4_ = 0;
      local_148._44_4_ = 0;
      local_148._48_4_ = 0;
      local_148._52_4_ = 0;
      local_148._56_5_ = 0;
      local_148._61_3_ = 0;
      local_148._64_4_ = 0;
      local_148[0x44] = false;
      v = pNVar17;
      if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)local_148 != pNVar10) &&
         (v = pNVar10,
         pNVar17 !=
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)local_148)) {
        local_148._0_8_ = *(undefined8 *)(pNVar17->val).m_backend.data._M_elems;
        local_148._8_8_ = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 2);
        local_148._16_8_ = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 4);
        local_148._24_8_ = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 6);
        local_148._32_8_ = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 8);
        local_148._40_8_ = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 10);
        local_148._48_8_ = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 0xc);
        uVar8 = *(undefined8 *)((pNVar17->val).m_backend.data._M_elems + 0xe);
        local_148._56_5_ = (undefined5)uVar8;
        local_148._61_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_148._64_4_ = (pNVar17->val).m_backend.exp;
        local_148[0x44] = (pNVar17->val).m_backend.neg;
        local_148._72_4_ = (pNVar17->val).m_backend.fpclass;
        local_148._76_4_ = (pNVar17->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                ((cpp_dec_float<100U,_int,_void> *)local_148,(cpp_dec_float<100U,_int,_void> *)v);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_f8,(cpp_dec_float<100U,_int,_void> *)local_148);
      pNVar17 = pNVar17 + 1;
      iVar14 = iVar14 + -1;
    } while (1 < iVar14);
  }
  this = local_38;
  pUVar3 = local_40;
  local_148._48_4_ = local_f8.data._M_elems[0xc];
  local_148._52_4_ = local_f8.data._M_elems[0xd];
  local_148._56_5_ = local_f8.data._M_elems._56_5_;
  local_148._61_3_ = local_f8.data._M_elems[0xf]._1_3_;
  local_148._32_4_ = local_f8.data._M_elems[8];
  local_148._36_4_ = local_f8.data._M_elems[9];
  local_148._40_4_ = local_f8.data._M_elems[10];
  local_148._44_4_ = local_f8.data._M_elems[0xb];
  local_148._16_4_ = local_f8.data._M_elems[4];
  local_148._20_4_ = local_f8.data._M_elems[5];
  local_148._24_4_ = local_f8.data._M_elems[6];
  local_148._28_4_ = local_f8.data._M_elems[7];
  local_148._0_4_ = local_f8.data._M_elems[0];
  local_148._4_4_ = local_f8.data._M_elems[1];
  local_148._8_4_ = local_f8.data._M_elems[2];
  local_148._12_4_ = local_f8.data._M_elems[3];
  pnVar6 = (local_40->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)(pnVar6 + nr) + 0x30) = local_f8.data._M_elems._48_8_;
  *(ulong *)((long)(pnVar6 + nr) + 0x38) =
       CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
  *(undefined8 *)((long)(pnVar6 + nr) + 0x20) = local_f8.data._M_elems._32_8_;
  *(undefined8 *)((long)(pnVar6 + nr) + 0x28) = local_f8.data._M_elems._40_8_;
  *(undefined8 *)((long)(pnVar6 + nr) + 0x10) = local_f8.data._M_elems._16_8_;
  *(undefined8 *)((long)(pnVar6 + nr) + 0x18) = local_f8.data._M_elems._24_8_;
  *(undefined8 *)&pnVar6[nr].m_backend = local_f8.data._M_elems._0_8_;
  *(undefined8 *)((long)&pnVar6[nr].m_backend + 8) = local_f8.data._M_elems._8_8_;
  *(int *)((long)(pnVar6 + nr) + 0x40) = local_f8.exp;
  *(bool *)((long)(pnVar6 + nr) + 0x44) = local_f8.neg;
  *(undefined8 *)((long)(pnVar6 + nr) + 0x48) = local_f8._72_8_;
  pSVar2 = (local_38->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = local_48;
  if (0 < pSVar2->theRep *
          ((pSVar2->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[nr]) {
LAB_0048ddea:
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearIdx(this_00,nr);
    return true;
  }
  pnVar6 = (local_40->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_198.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[nr].m_backend;
  local_198.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[nr].m_backend + 8);
  local_198.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x10);
  local_198.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x18);
  local_198.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x20);
  local_198.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x28);
  local_198.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x30);
  uVar8 = *(undefined8 *)((long)(pnVar6 + nr) + 0x38);
  local_198.data._M_elems._56_5_ = SUB85(uVar8,0);
  local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
  local_198.exp = *(int *)((long)(pnVar6 + nr) + 0x40);
  local_198.neg = *(bool *)((long)(pnVar6 + nr) + 0x44);
  local_198._72_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x48);
  pnVar6 = (local_40->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98.exp = pnVar6[nr].m_backend.exp;
  local_98.neg = pnVar6[nr].m_backend.neg;
  local_98.fpclass = pnVar6[nr].m_backend.fpclass;
  local_98.prec_elem = pnVar6[nr].m_backend.prec_elem;
  local_98.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[nr].m_backend.data;
  local_98.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[nr].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x10);
  local_98.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x20);
  local_98.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_98.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x30);
  local_98.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  uVar8 = *(undefined8 *)(puVar1 + 2);
  local_98.data._M_elems._56_5_ = SUB85(uVar8,0);
  local_98.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
  if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_0048e05b:
    pVVar11 = ((this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver)->theUbound;
  }
  else {
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems._56_5_ = 0;
    local_f8.data._M_elems[0xf]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_f8,0.0);
    iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_98,&local_f8);
    if (iVar13 < 1) goto LAB_0048e05b;
    pVVar11 = ((this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver)->theLbound;
  }
  pcVar15 = &(pVVar11->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
  pcVar16 = &(pUVar3->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
  local_148._72_4_ = cpp_dec_float_finite;
  local_148._76_4_ = 0x10;
  local_148._0_4_ = 0;
  local_148._4_4_ = 0;
  local_148._8_4_ = 0;
  local_148._12_4_ = 0;
  local_148._16_4_ = 0;
  local_148._20_4_ = 0;
  local_148._24_4_ = 0;
  local_148._28_4_ = 0;
  local_148._32_4_ = 0;
  local_148._36_4_ = 0;
  local_148._40_4_ = 0;
  local_148._44_4_ = 0;
  local_148._48_4_ = 0;
  local_148._52_4_ = 0;
  local_148._56_5_ = 0;
  local_148._61_3_ = 0;
  local_148._64_4_ = 0;
  local_148[0x44] = false;
  if ((cpp_dec_float<100U,_int,_void> *)local_148 == pcVar16) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)local_148,pcVar15);
    if (local_148._0_4_ != 0 || local_148._72_4_ != cpp_dec_float_finite) {
      local_148[0x44] = local_148[0x44] ^ 1;
    }
  }
  else {
    if ((cpp_dec_float<100U,_int,_void> *)local_148 != pcVar15) {
      local_148._0_8_ = *(undefined8 *)(pcVar15->data)._M_elems;
      local_148._8_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 2);
      local_148._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
      local_148._24_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 6);
      local_148._32_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 8);
      local_148._40_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 10);
      local_148._48_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 0xc);
      uVar8 = *(undefined8 *)((pcVar15->data)._M_elems + 0xe);
      local_148._56_5_ = (undefined5)uVar8;
      local_148._61_3_ = (undefined3)((ulong)uVar8 >> 0x28);
      local_148._64_4_ = pcVar15->exp;
      local_148[0x44] = pcVar15->neg;
      local_148._72_4_ = pcVar15->fpclass;
      local_148._76_4_ = pcVar15->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)local_148,pcVar16);
  }
  local_f8.fpclass = cpp_dec_float_finite;
  local_f8.prec_elem = 0x10;
  local_f8.data._M_elems[0] = 0;
  local_f8.data._M_elems[1] = 0;
  local_f8.data._M_elems[2] = 0;
  local_f8.data._M_elems[3] = 0;
  local_f8.data._M_elems[4] = 0;
  local_f8.data._M_elems[5] = 0;
  local_f8.data._M_elems[6] = 0;
  local_f8.data._M_elems[7] = 0;
  local_f8.data._M_elems[8] = 0;
  local_f8.data._M_elems[9] = 0;
  local_f8.data._M_elems[10] = 0;
  local_f8.data._M_elems[0xb] = 0;
  local_f8.data._M_elems[0xc] = 0;
  local_f8.data._M_elems[0xd] = 0;
  local_f8.data._M_elems._56_5_ = 0;
  local_f8.data._M_elems[0xf]._1_3_ = 0;
  local_f8.exp = 0;
  local_f8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_f8,(cpp_dec_float<100U,_int,_void> *)local_148,&local_98);
  *(undefined8 *)((sel->m_backend).data._M_elems + 0xc) = local_f8.data._M_elems._48_8_;
  *(ulong *)((sel->m_backend).data._M_elems + 0xe) =
       CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
  *(undefined8 *)((sel->m_backend).data._M_elems + 8) = local_f8.data._M_elems._32_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 10) = local_f8.data._M_elems._40_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_f8.data._M_elems._16_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 6) = local_f8.data._M_elems._24_8_;
  *(undefined8 *)(sel->m_backend).data._M_elems = local_f8.data._M_elems._0_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 2) = local_f8.data._M_elems._8_8_;
  (sel->m_backend).exp = local_f8.exp;
  (sel->m_backend).neg = local_f8.neg;
  (sel->m_backend).fpclass = local_f8.fpclass;
  (sel->m_backend).prec_elem = local_f8.prec_elem;
  pVVar11 = local_a8;
LAB_0048e2f1:
  pnVar6 = (pVVar18->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pnVar6[nr].m_backend.fpclass == cpp_dec_float_NaN) ||
      (pnVar7 = (pVVar11->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pnVar7[nr].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&pnVar6[nr].m_backend,&pnVar7[nr].m_backend), iVar13 != 0)) {
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems._56_5_ = 0;
    local_f8.data._M_elems[0xf]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_f8,&(this->fastDelta).m_backend,local_a0);
    if ((((sel->m_backend).fpclass != cpp_dec_float_NaN) && (local_f8.fpclass != cpp_dec_float_NaN))
       && ((iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&sel->m_backend,&local_f8), 0 < iVar13 &&
           (boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)sel,0.0), !polish)))) {
      if (local_98.fpclass != cpp_dec_float_NaN) {
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems._56_5_ = 0;
        local_f8.data._M_elems[0xf]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_f8,0.0);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_98,&local_f8);
        if (iVar13 < 0) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar18->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
          pnVar6 = (pVVar18->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar6[nr].m_backend.data = local_198.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar6[nr].m_backend.data + 8) = local_198.data._M_elems._8_8_;
          puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = local_198.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._24_8_;
          puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x20);
          *(undefined8 *)puVar1 = local_198.data._M_elems._32_8_;
          *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._40_8_;
          puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x30);
          *(undefined8 *)puVar1 = local_198.data._M_elems._48_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
          pnVar6[nr].m_backend.exp = local_198.exp;
          pnVar6[nr].m_backend.neg = local_198.neg;
          pnVar6[nr].m_backend.fpclass = local_198.fpclass;
          pnVar6[nr].m_backend.prec_elem = local_198.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar18->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
          return false;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar11->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
      pnVar6 = (pVVar11->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)&pnVar6[nr].m_backend.data = local_198.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar6[nr].m_backend.data + 8) = local_198.data._M_elems._8_8_;
      puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_198.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._24_8_;
      puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = local_198.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._40_8_;
      puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = local_198.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
      pnVar6[nr].m_backend.exp = local_198.exp;
      pnVar6[nr].m_backend.neg = local_198.neg;
      pnVar6[nr].m_backend.fpclass = local_198.fpclass;
      pnVar6[nr].m_backend.prec_elem = local_198.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar11->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    if (!polish) {
      if (((local_198.fpclass == cpp_dec_float_NaN) ||
          (pnVar6 = (pVVar18->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar6[nr].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_198,&pnVar6[nr].m_backend), iVar13 < 1)) {
        pcVar15 = &(pVVar11->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems._56_5_ = 0;
        local_f8.data._M_elems[0xf]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        if (&local_f8 != pcVar15) {
          local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar15->data)._M_elems;
          local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 2);
          local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
          local_f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 6);
          local_f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 8);
          local_f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 10);
          local_f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 0xc);
          uVar8 = *(undefined8 *)((pcVar15->data)._M_elems + 0xe);
          local_f8.data._M_elems._56_5_ = SUB85(uVar8,0);
          local_f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
          local_f8.exp = pcVar15->exp;
          local_f8.neg = pcVar15->neg;
          local_f8.fpclass = pcVar15->fpclass;
          local_f8.prec_elem = pcVar15->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_f8,&local_198);
        pSVar2 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      else {
        pcVar15 = &(pVVar18->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems._56_5_ = 0;
        local_f8.data._M_elems[0xf]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        if (&local_f8 == pcVar15) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_f8,&local_198);
          if (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) {
            local_f8.neg = (bool)(local_f8.neg ^ 1);
          }
        }
        else {
          local_f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
          local_f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
          local_f8.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
          local_f8.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
          local_f8.data._M_elems[8] = local_198.data._M_elems[8];
          local_f8.data._M_elems[9] = local_198.data._M_elems[9];
          local_f8.data._M_elems[10] = local_198.data._M_elems[10];
          local_f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
          local_f8.data._M_elems[4] = local_198.data._M_elems[4];
          local_f8.data._M_elems[5] = local_198.data._M_elems[5];
          local_f8.data._M_elems[6] = local_198.data._M_elems[6];
          local_f8.data._M_elems[7] = local_198.data._M_elems[7];
          local_f8.data._M_elems[0] = local_198.data._M_elems[0];
          local_f8.data._M_elems[1] = local_198.data._M_elems[1];
          local_f8.data._M_elems[2] = local_198.data._M_elems[2];
          local_f8.data._M_elems[3] = local_198.data._M_elems[3];
          local_f8.exp = local_198.exp;
          local_f8.neg = local_198.neg;
          local_f8.fpclass = local_198.fpclass;
          local_f8.prec_elem = local_198.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_f8,pcVar15);
        }
        pSVar2 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&(pSVar2->theShift).m_backend,&local_f8);
      pnVar6 = (pVVar11->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = local_198.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
      puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = local_198.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._40_8_;
      puVar1 = (uint *)((long)&pnVar6[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_198.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._24_8_;
      *(undefined8 *)&pnVar6[nr].m_backend.data = local_198.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar6[nr].m_backend.data + 8) = local_198.data._M_elems._8_8_;
      pnVar6[nr].m_backend.exp = local_198.exp;
      pnVar6[nr].m_backend.neg = local_198.neg;
      pnVar6[nr].m_backend.fpclass = local_198.fpclass;
      pnVar6[nr].m_backend.prec_elem = local_198.prec_elem;
      pnVar7 = (pVVar18->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar7[nr].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = local_198.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
      puVar1 = (uint *)((long)&pnVar7[nr].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = local_198.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._40_8_;
      puVar1 = (uint *)((long)&pnVar7[nr].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_198.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._24_8_;
      *(undefined8 *)&pnVar7[nr].m_backend.data = local_198.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar7[nr].m_backend.data + 8) = local_198.data._M_elems._8_8_;
      pnVar7[nr].m_backend.exp = pnVar6[nr].m_backend.exp;
      pnVar7[nr].m_backend.neg = pnVar6[nr].m_backend.neg;
      iVar9 = pnVar6[nr].m_backend.prec_elem;
      pnVar7[nr].m_backend.fpclass = pnVar6[nr].m_backend.fpclass;
      pnVar7[nr].m_backend.prec_elem = iVar9;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::minReEnter(
   R& sel,
   R maxabs,
   const SPxId& id,
   int nr,
   bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d > 0.0)
         sel = (this->thesolver->lcBound()[nr] - cvec[nr]) / d;
      else
         sel = (this->thesolver->ucBound()[nr] - cvec[nr]) / d;
   }

   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d > 0.0)
         sel = (this->thesolver->lpBound()[nr] - pvec[nr]) / d;
      else
         sel = (this->thesolver->upBound()[nr] - pvec[nr]) / d;
   }

   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d < 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}